

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult access_tvm_trvm(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  uint64_t uVar2;
  uint uVar3;
  
  iVar1 = arm_current_el(env);
  if (iVar1 == 1) {
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    uVar3 = 0x4000000;
    if (isread) {
      uVar3 = 0x40000000;
    }
    if (((uint)uVar2 & uVar3) != 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult access_tvm_trvm(CPUARMState *env, const ARMCPRegInfo *ri,
                                      bool isread)
{
    if (arm_current_el(env) == 1) {
        uint64_t trap = isread ? HCR_TRVM : HCR_TVM;
        if (arm_hcr_el2_eff(env) & trap) {
            return CP_ACCESS_TRAP_EL2;
        }
    }
    return CP_ACCESS_OK;
}